

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.hpp
# Opt level: O0

string * __thiscall
de::toString<tcu::Format::Hex<4ul>>(string *__return_storage_ptr__,de *this,Hex<4UL> *value)

{
  ostringstream local_190 [8];
  ostringstream s;
  Hex<4UL> *value_local;
  
  s._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  tcu::Format::operator<<((ostream *)local_190,(Hex<4UL>)*(deUint64 *)s._368_8_);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString (const T& value)
{
	std::ostringstream s;
	s << value;
	return s.str();
}